

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O0

nbt_node * nbt_find(nbt_node *tree,nbt_predicate_t predicate,void *aux)

{
  _Bool _Var1;
  nbt_node *pnVar2;
  nbt_list *local_50;
  nbt_node *found;
  nbt_list *p;
  nbt_list *list;
  list_head *pos;
  void *aux_local;
  nbt_predicate_t predicate_local;
  nbt_node *tree_local;
  
  if (tree == (nbt_node *)0x0) {
    tree_local = (nbt_node *)0x0;
  }
  else {
    _Var1 = (*predicate)(tree,aux);
    tree_local = tree;
    if (!_Var1) {
      if ((tree->type == TAG_LIST) || (tree->type == TAG_COMPOUND)) {
        if (tree->type == TAG_LIST) {
          local_50 = (tree->payload).tag_list;
        }
        else {
          local_50 = (tree->payload).tag_list;
        }
        for (list = (nbt_list *)(local_50->entry).flink; list != (nbt_list *)&local_50->entry;
            list = (nbt_list *)(list->entry).blink) {
          pnVar2 = nbt_find((nbt_node *)list[-1].entry.flink,predicate,aux);
          if (pnVar2 != (nbt_node *)0x0) {
            return pnVar2;
          }
        }
        tree_local = (nbt_node *)0x0;
      }
      else {
        tree_local = (nbt_node *)0x0;
      }
    }
  }
  return tree_local;
}

Assistant:

nbt_node* nbt_find(nbt_node* tree, nbt_predicate_t predicate, void* aux)
{
    if(tree == NULL)                  return NULL;
    if(predicate(tree, aux))          return tree;
    if(tree->type != TAG_LIST &&
       tree->type != TAG_COMPOUND)    return NULL;

    struct list_head* pos;
    struct nbt_list* list = tree->type == TAG_LIST ? tree->payload.tag_list : tree->payload.tag_compound;
    
    list_for_each(pos, &list->entry)
    {
        struct nbt_list* p = list_entry(pos, struct nbt_list, entry);
        struct nbt_node* found;

        if((found = nbt_find(p->data, predicate, aux)))
            return found;
    }

    return NULL;
}